

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

size_t __thiscall
trieste::PassDef::apply_special<true,false,true>(PassDef *this,Node *root,Match *match)

{
  TokenDef *pTVar1;
  undefined8 *puVar2;
  element_type *node;
  char cVar3;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var4;
  ptrdiff_t pVar5;
  element_type *peVar6;
  Token TVar7;
  element_type *peVar8;
  long lVar9;
  _Base_ptr p_Var10;
  undefined8 *puVar11;
  iterator start;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  iterator start_1;
  Node root_1;
  size_t local_98;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_90;
  PassDef *local_80;
  NodeIt local_78;
  iterator iStack_70;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_68;
  shared_ptr<trieste::NodeDef> *local_60;
  NodeIt local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Token local_40;
  element_type *local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pTVar1 = (local_50->type_).def;
  if ((pTVar1->fl & 0x40) == 0) {
    lVar9 = *(long *)((long)(this->rule_map).map._M_elems +
                     (ulong)(pTVar1->default_map_id & 0xfffffff8));
    local_80 = this;
    if (*(char *)(lVar9 + 0x418) == '\0') {
      local_78._M_current =
           (local_50->children).
           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (local_78._M_current ==
          (local_50->children).
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_98 = 0;
      }
      else {
        local_98 = 0;
        do {
          puVar11 = *(undefined8 **)
                     (lVar9 + 0x18 +
                     (ulong)((((((local_78._M_current)->
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->type_).def)->default_map_id & 0xfffffff8));
          puVar2 = (undefined8 *)puVar11[1];
          for (puVar11 = (undefined8 *)*puVar11; puVar11 != puVar2; puVar11 = puVar11 + 0x14) {
            match->index = 0;
            ((match->captures).
             super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = false;
            local_90.first = local_78._M_current;
            cVar3 = (**(code **)(*(long *)*puVar11 + 0x20))
                              ((long *)*puVar11,&local_78,(Node *)&stack0xffffffffffffffb0,match);
            if (cVar3 != '\0') {
              local_60 = local_78._M_current;
              _Var4 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                (local_90.first);
              if ((_Var4._M_current == local_60) &&
                 (pVar5 = replace(local_80,match,(Effect<Node> *)(puVar11 + 0x10),
                                  (NodeIt *)&local_90,&local_78,(Node *)&stack0xffffffffffffffb0),
                 pVar5 != -1)) {
                local_98 = local_98 + pVar5;
                if ((local_80->direction_ & 4) == 0) {
                  local_78._M_current =
                       (local_50->children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  local_78._M_current = local_78._M_current + pVar5;
                }
                goto LAB_0018e35c;
              }
            }
            local_78._M_current = local_90.first;
          }
          local_78._M_current = local_78._M_current + 1;
LAB_0018e35c:
        } while (local_78._M_current !=
                 (local_50->children).
                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      local_98 = 0;
    }
    local_90.first = (shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffb0;
    local_78._M_current = (shared_ptr<trieste::NodeDef> *)0x0;
    iStack_70._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_68 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_90.second._M_current =
         (local_50->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_78,(iterator)0x0,&local_90);
    if ((pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
         *)local_78._M_current != iStack_70._M_current) {
      local_40.def = (TokenDef *)&(local_80->post_)._M_t._M_impl.super__Rb_tree_header;
      do {
        node = (element_type *)iStack_70._M_current[-1].second._M_current;
        peVar8 = ((iStack_70._M_current[-1].first)->
                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (node == (element_type *)
                    (peVar8->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
          p_Var10 = (local_80->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var10 != (_Base_ptr)0x0) {
            pTVar1 = (peVar8->type_).def;
            TVar7.def = local_40.def;
            do {
              if (*(TokenDef **)(p_Var10 + 1) >= pTVar1) {
                TVar7.def = (TokenDef *)p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[*(TokenDef **)(p_Var10 + 1) < pTVar1];
            } while (p_Var10 != (_Base_ptr)0x0);
            if ((TVar7.def != local_40.def) && (*(TokenDef **)((long)TVar7.def + 0x20) <= pTVar1)) {
              local_90.second._M_current =
                   (shared_ptr<trieste::NodeDef> *)
                   ((iStack_70._M_current[-1].first)->
                   super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                   _M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_90.second._M_current)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_90.second._M_current)->_M_use_count + 1;
                }
              }
              local_90.first = (shared_ptr<trieste::NodeDef> *)peVar8;
              if (((_Base_ptr)((long)TVar7.def + 0x20))->_M_right == (_Base_ptr)0x0) {
                std::__throw_bad_function_call();
              }
              lVar9 = (**(code **)((long)TVar7.def + 0x40))
                                (&((_Base_ptr)((long)TVar7.def + 0x20))->_M_parent,&local_90);
              local_98 = lVar9 + local_98;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_90.second._M_current);
              }
            }
          }
          iStack_70._M_current = iStack_70._M_current + -1;
        }
        else {
          iStack_70._M_current[-1].second._M_current = (shared_ptr<trieste::NodeDef> *)&node->type_;
          peVar8 = ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                   &node->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr;
          pTVar1 = (peVar8->type_).def;
          if ((pTVar1->fl & 0x40) == 0) {
            lVar9 = *(long *)((long)(local_80->rule_map).map._M_elems +
                             (ulong)(pTVar1->default_map_id & 0xfffffff8));
            if (*(char *)(lVar9 + 0x418) == '\0') {
              peVar6 = (element_type *)
                       (peVar8->children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (peVar6 == *(element_type **)
                             ((long)&(((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *
                                       )&node->super_enable_shared_from_this<trieste::NodeDef>)->
                                      _M_ptr->children).
                                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                     ._M_impl.super__Vector_impl_data + 8)) {
                local_60 = (shared_ptr<trieste::NodeDef> *)0x0;
              }
              else {
                local_60 = (shared_ptr<trieste::NodeDef> *)0x0;
                do {
                  puVar11 = *(undefined8 **)
                             (lVar9 + 0x18 +
                             (ulong)(((((element_type *)(peVar6->origin_)._M_dataplus._M_p)->type_).
                                     def)->default_map_id & 0xfffffff8));
                  puVar2 = (undefined8 *)puVar11[1];
                  local_58._M_current = (shared_ptr<trieste::NodeDef> *)peVar6;
                  for (puVar11 = (undefined8 *)*puVar11; puVar11 != puVar2; puVar11 = puVar11 + 0x14
                      ) {
                    match->index = 0;
                    ((match->captures).
                     super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first = false;
                    local_90.first = local_58._M_current;
                    cVar3 = (**(code **)(*(long *)*puVar11 + 0x20))
                                      ((long *)*puVar11,&local_90,node,match);
                    if (cVar3 != '\0') {
                      local_38 = (element_type *)local_90.first;
                      _Var4 = std::
                              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                        (local_58._M_current);
                      if (((element_type *)_Var4._M_current == local_38) &&
                         (pVar5 = replace(local_80,match,(Effect<Node> *)(puVar11 + 0x10),&local_58,
                                          (NodeIt *)&local_90,(Node *)node), pVar5 != -1)) {
                        local_60 = (shared_ptr<trieste::NodeDef> *)
                                   ((long)&(local_60->
                                           super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + pVar5);
                        if ((local_80->direction_ & 4) == 0) {
                          peVar6 = (element_type *)
                                   (((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                                    &node->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr
                                   ->children).
                                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        }
                        else {
                          peVar6 = (element_type *)
                                   (&((string *)
                                     &(local_90.first)->
                                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                     )->_M_dataplus + pVar5 * 2);
                        }
                        goto LAB_0018e50f;
                      }
                    }
                  }
                  peVar6 = (element_type *)(local_58._M_current + 1);
LAB_0018e50f:
                } while (peVar6 != *(element_type **)
                                    ((long)&(((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                               *)&node->
                                                  super_enable_shared_from_this<trieste::NodeDef>)->
                                             _M_ptr->children).
                                            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                            ._M_impl.super__Vector_impl_data + 8));
              }
              local_98 = (long)&(local_60->
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + local_98;
              peVar8 = ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                       &node->super_enable_shared_from_this<trieste::NodeDef>)->_M_ptr;
            }
            local_90.second._M_current =
                 (peVar8->children).
                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_90.first = (shared_ptr<trieste::NodeDef> *)node;
            if (iStack_70._M_current == local_68) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_78,iStack_70,&local_90);
            }
            else {
              (iStack_70._M_current)->first = (shared_ptr<trieste::NodeDef> *)node;
              ((iStack_70._M_current)->second)._M_current = local_90.second._M_current;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
          }
        }
      } while ((pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)local_78._M_current != iStack_70._M_current);
    }
    if ((pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
         *)local_78._M_current !=
        (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
         *)0x0) {
      operator_delete(local_78._M_current,(long)local_68 - (long)local_78._M_current);
    }
  }
  else {
    local_98 = 0;
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  return local_98;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }